

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O1

void __thiscall
TEST_RunIgnoredTest_IgnoreTestWillGetRunIfOptionSpecified_Test::testBody
          (TEST_RunIgnoredTest_IgnoreTestWillGetRunIfOptionSpecified_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  char *argv [2];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  
  argv[0] = "tests.exe";
  argv[1] = "-ri";
  CommandLineTestRunner::CommandLineTestRunner
            (&commandLineTestRunner.super_CommandLineTestRunner,2,argv,
             &(this->super_TEST_GROUP_CppUTestGroupRunIgnoredTest).registry);
  commandLineTestRunner.super_CommandLineTestRunner._vptr_CommandLineTestRunner =
       (_func_int **)&PTR__CommandLineTestRunner_003483c0;
  commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_ = (StringBufferTestOutput *)0x0;
  commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer = (StringBufferTestOutput *)0x0;
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer = (StringBufferTestOutput *)0x0;
  CommandLineTestRunner::runAllTestsMain(&commandLineTestRunner.super_CommandLineTestRunner);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = RunIgnoredUtest::Checker;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK_TRUE","RunIgnoredUtest::Checker",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x1ca,pTVar3);
  CommandLineTestRunner::~CommandLineTestRunner(&commandLineTestRunner.super_CommandLineTestRunner);
  return;
}

Assistant:

TEST(RunIgnoredTest, IgnoreTestWillGetRunIfOptionSpecified)
{
    const char* argv[] = { "tests.exe", "-ri" };

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    CHECK_TRUE( RunIgnoredUtest::Checker );
}